

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O1

Aig_Obj_t * Dar_LibBuildBest_rec(Dar_Man_t *p,Dar_LibObj_t *pObj)

{
  Dar_LibDat_t *pDVar1;
  ulong uVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  
  pDVar1 = s_DarLib->pDatas;
  uVar2 = (ulong)*pObj >> 0x24;
  pAVar3 = pDVar1[uVar2].field_0.pFunc;
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    pAVar3 = Dar_LibBuildBest_rec
                       (p,(Dar_LibObj_t *)
                          (&s_DarLib->pObjs->field_0x0 + ((SUB84(*pObj,0) & 0xffff) << 3)));
    pAVar4 = Dar_LibBuildBest_rec(p,s_DarLib->pObjs + *(ushort *)&pObj->field_0x2);
    pAVar3 = Aig_And(p->pAig,(Aig_Obj_t *)((ulong)(SUB84(*pObj,4) & 1) ^ (ulong)pAVar3),
                     (Aig_Obj_t *)((ulong)(SUB84(*pObj,4) >> 1 & 1) ^ (ulong)pAVar4));
    pDVar1[uVar2].field_0.pFunc = pAVar3;
  }
  return pAVar3;
}

Assistant:

Aig_Obj_t * Dar_LibBuildBest_rec( Dar_Man_t * p, Dar_LibObj_t * pObj )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Dar_LibDat_t * pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->pFunc )
        return pData->pFunc;
    pFanin0 = Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan0) );
    pFanin1 = Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan1) );
    pFanin0 = Aig_NotCond( pFanin0, pObj->fCompl0 );
    pFanin1 = Aig_NotCond( pFanin1, pObj->fCompl1 );
    pData->pFunc = Aig_And( p->pAig, pFanin0, pFanin1 );
//    assert( pData->Level == (int)Aig_Regular(pData->pFunc)->Level );
    return pData->pFunc;
}